

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc-send-recv.c
# Opt level: O2

void ipc_send_recv_helper_threadproc(void *arg)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t loop;
  
  iVar1 = uv_loop_init(&loop);
  if (iVar1 == 0) {
    run_ipc_send_recv_helper(&loop,1);
    iVar1 = uv_loop_close(&loop);
    if (iVar1 == 0) {
      return;
    }
    uVar2 = 0x1ac;
  }
  else {
    uVar2 = 0x1a6;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc-send-recv.c"
          ,uVar2,"r == 0");
  abort();
}

Assistant:

void ipc_send_recv_helper_threadproc(void* arg) {
  int r;
  uv_loop_t loop;

  r = uv_loop_init(&loop);
  ASSERT(r == 0);

  r = run_ipc_send_recv_helper(&loop, 1);
  ASSERT(r == 0);

  r = uv_loop_close(&loop);
  ASSERT(r == 0);
}